

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O2

int ggml::cpu::aarch64::repack<block_iq4_nl,4l,4l>(ggml_tensor *t,void *data,size_t data_size)

{
  ggml_half gVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  undefined8 uVar7;
  ulong uVar8;
  int iVar9;
  undefined8 *puVar10;
  int64_t x;
  ulong uVar11;
  ggml_half (*pagVar12) [4];
  int i_1;
  undefined8 *puVar13;
  block_iq4_nl *pbVar14;
  int i;
  long lVar15;
  block_iq4_nl dst_tmp [4];
  block_iq4_nlx4 out;
  
  if (t->type == GGML_TYPE_IQ4_NL) {
    pagVar12 = (ggml_half (*) [4])t->data;
    iVar3 = ggml_nrows();
    iVar4 = (int)(t->ne[0] / 0x20);
    if ((long)(iVar3 * iVar4) * 0x12 - data_size == 0) {
      if ((t->ne[0] & 7U) == 0 && (t->ne[1] & 3U) == 0) {
        uVar8 = (ulong)iVar4;
        iVar5 = 0;
        for (iVar9 = 0; iVar9 < iVar3; iVar9 = iVar9 + 4) {
          puVar10 = (undefined8 *)data;
          for (uVar11 = 0; uVar11 != (~((long)uVar8 >> 0x3f) & uVar8); uVar11 = uVar11 + 1) {
            puVar13 = puVar10;
            for (lVar15 = 0; lVar15 != 0x48; lVar15 = lVar15 + 0x12) {
              *(undefined2 *)(dst_tmp[0].qs + lVar15 + 0xe) = *(undefined2 *)(puVar13 + 2);
              uVar7 = *puVar13;
              uVar2 = puVar13[1];
              puVar13 = (undefined8 *)((long)puVar13 + uVar8 * 0x12);
              *(undefined8 *)(dst_tmp[0].qs + lVar15 + -2) = uVar7;
              *(undefined8 *)(dst_tmp[0].qs + lVar15 + 6) = uVar2;
            }
            pbVar14 = dst_tmp;
            for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
              gVar1 = pbVar14->d;
              pbVar14 = (block_iq4_nl *)((long)pbVar14 + 0x12);
              out.d[lVar15] = gVar1;
            }
            for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 1) {
              *(undefined4 *)(out.qs + lVar15 * 4) =
                   *(undefined4 *)(dst_tmp[(uint)lVar15 & 3].qs + ((uint)lVar15 & 0xc));
            }
            puVar10 = (undefined8 *)((long)puVar10 + 0x12);
            pagVar12[8] = (ggml_half  [4])out.qs._56_8_;
            *pagVar12 = out.d;
            pagVar12[1] = (ggml_half  [4])out.qs._0_8_;
            pagVar12[2] = (ggml_half  [4])out.qs._8_8_;
            pagVar12[3] = (ggml_half  [4])out.qs._16_8_;
            pagVar12[4] = (ggml_half  [4])out.qs._24_8_;
            pagVar12[5] = (ggml_half  [4])out.qs._32_8_;
            pagVar12[6] = (ggml_half  [4])out.qs._40_8_;
            pagVar12[7] = (ggml_half  [4])out.qs._48_8_;
            pagVar12 = pagVar12 + 9;
          }
          data = (void *)((long)data + (long)(iVar4 * 4) * 0x12);
        }
      }
      else {
        iVar5 = -1;
      }
      return iVar5;
    }
    pcVar6 = "data_size == nrow * nblocks * sizeof(block_iq4_nl)";
    uVar7 = 0x172e;
  }
  else {
    pcVar6 = "t->type == GGML_TYPE_IQ4_NL";
    uVar7 = 0x1723;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
             ,uVar7,"GGML_ASSERT(%s) failed",pcVar6);
}

Assistant:

static int repack_iq4_nl_to_iq4_nl_4_bl(struct ggml_tensor * t, int interleave_block, const void * GGML_RESTRICT data, size_t data_size) {
    GGML_ASSERT(t->type == GGML_TYPE_IQ4_NL);
    //GGML_ASSERT(interleave_block == 4 || interleave_block == 8);
    GGML_ASSERT(interleave_block == 4);

    block_iq4_nlx4 * dst = (block_iq4_nlx4 *)t->data;
    const block_iq4_nl * src = (const block_iq4_nl *)data;
    block_iq4_nl dst_tmp[4];
    int nrow = ggml_nrows(t);
    int nrows_interleaved = 4;
    int nblocks = t->ne[0] / QK4_0;

    GGML_ASSERT(data_size == nrow * nblocks * sizeof(block_iq4_nl));

    if (t->ne[1] % nrows_interleaved != 0 || t->ne[0] % 8 != 0) {
        return -1;
    }

    for (int b = 0; b < nrow; b += nrows_interleaved) {
        for (int64_t x = 0; x < nblocks; x++) {
            for (int i = 0; i < nrows_interleaved; i++) {
                dst_tmp[i] = src[x + i * nblocks];
            }
            *dst++ = make_block_iq4_nlx4(dst_tmp, interleave_block);
        }
        src += nrows_interleaved * nblocks;
    }
    return 0;

    GGML_UNUSED(data_size);
}